

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall MacProj::setup(MacProj *this,int level)

{
  bool bVar1;
  int iVar2;
  AmrLevel **ppAVar3;
  AmrLevel *this_00;
  pointer __p;
  int in_ESI;
  BoxArray *in_RDI;
  DistributionMapping *dmap;
  BoxArray *grids;
  nullptr_t in_stack_ffffffffffffff58;
  Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *in_stack_ffffffffffffff60;
  BoxArray *info;
  DistributionMapping *pDVar4;
  DistributionMapping *dm;
  undefined4 in_stack_ffffffffffffffa0;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffffb0;
  DistributionMapping local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  DistributionMapping *local_20;
  BoxArray *local_18;
  
  iVar2 = amrex::AmrMesh::maxLevel(*(AmrMesh **)&in_RDI->m_bat);
  if (in_ESI < iVar2) {
    amrex::
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    bVar1 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      ppAVar3 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                          (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      local_18 = amrex::AmrLevel::boxArray(*ppAVar3);
      ppAVar3 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                          (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      local_20 = amrex::AmrLevel::DistributionMap(*ppAVar3);
      this_00 = (AmrLevel *)
                amrex::
                Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                              *)in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      operator_new(0x180);
      local_38 = 0;
      uStack_30 = 0;
      local_48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_28 = 0;
      dm = &local_48;
      info = local_18;
      pDVar4 = local_20;
      amrex::MFInfo::MFInfo((MFInfo *)0x5a7b62);
      amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)this_00,
                 (size_type)in_stack_ffffffffffffff58);
      __p = (pointer)amrex::AmrLevel::Factory(this_00);
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),in_RDI,dm,
                 (int)((ulong)pDVar4 >> 0x20),(int)pDVar4,(MFInfo *)info,in_stack_ffffffffffffffb0);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::reset
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)this_00,__p);
      amrex::MFInfo::~MFInfo((MFInfo *)0x5a7bc7);
      amrex::
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)this_00,(size_type)__p);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x5a7be5);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)this_00,(value_type)__p);
    }
  }
  return;
}

Assistant:

void
MacProj::setup (int level)
{
    if (level < parent->maxLevel())
    {
        if (mac_phi_crse[level] == nullptr)
        {
            const BoxArray& grids = LevelData[level]->boxArray();
            const DistributionMapping& dmap = LevelData[level]->DistributionMap();
            mac_phi_crse[level].reset(new MultiFab(grids,dmap,1,1, MFInfo(), LevelData[level]->Factory()));
            mac_phi_crse[level]->setVal(0.0);
        }
    }
}